

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotStairsEx<ImPlot::GetterXsYs<double>>(char *label_id,GetterXsYs<double> *getter)

{
  double dVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  TransformerLogLog transformer;
  ImPlotPlot *pIVar6;
  ImPlotRange *pIVar7;
  ImPlotContext *pIVar8;
  GetterXsYs<double> *getter_00;
  bool bVar9;
  ImU32 col;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  double *pdVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  float fVar17;
  double dVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  float fVar21;
  double dVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined8 local_a0;
  float local_94;
  GetterXsYs<double> *local_90;
  undefined8 local_88;
  ImU32 local_80;
  ImU32 local_7c;
  ImDrawList *local_78;
  uint local_6c;
  ulong local_68;
  long local_60;
  ulong local_58;
  double *local_50;
  double *local_48;
  undefined8 local_40;
  long local_38;
  
  bVar9 = BeginItem(label_id,0);
  pIVar8 = GImPlot;
  if (bVar9) {
    if ((GImPlot->FitThisFrame == true) && (iVar2 = getter->Count, 0 < iVar2)) {
      pdVar12 = getter->Xs;
      pdVar13 = getter->Ys;
      iVar16 = getter->Offset;
      iVar3 = getter->Stride;
      pIVar6 = GImPlot->CurrentPlot;
      iVar15 = pIVar6->CurrentYAxis;
      uVar4 = (pIVar6->XAxis).Flags;
      pIVar7 = GImPlot->ExtentsY;
      uVar5 = pIVar6->YAxis[iVar15].Flags;
      iVar14 = 0;
      local_88 = CONCAT44(local_88._4_4_,uVar5) & 0xffffffff00000020;
      local_40 = (ImPlotContext *)(CONCAT44(local_40._4_4_,uVar4) & 0xffffffff00000020);
      do {
        lVar10 = (long)(((iVar16 + iVar14) % iVar2 + iVar2) % iVar2) * (long)iVar3;
        dVar1 = *(double *)((long)pdVar12 + lVar10);
        dVar18 = *(double *)((long)pdVar13 + lVar10);
        uVar19 = SUB84(dVar18,0);
        uVar20 = (undefined4)((ulong)dVar18 >> 0x20);
        if ((uVar4 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar1) < 0x7ff0000000000000) {
LAB_001e8198:
            if ((0.0 < dVar1) || ((int)local_40 == 0)) {
              uVar23 = SUB84(dVar1,0);
              uVar25 = (undefined4)((ulong)dVar1 >> 0x20);
              dVar22 = (pIVar8->ExtentsX).Min;
              uVar24 = uVar23;
              uVar26 = uVar25;
              if (dVar22 <= dVar1) {
                uVar24 = SUB84(dVar22,0);
                uVar26 = (undefined4)((ulong)dVar22 >> 0x20);
              }
              (pIVar8->ExtentsX).Min = (double)CONCAT44(uVar26,uVar24);
              dVar22 = (pIVar8->ExtentsX).Max;
              if (dVar1 <= dVar22) {
                uVar23 = SUB84(dVar22,0);
                uVar25 = (undefined4)((ulong)dVar22 >> 0x20);
              }
              (pIVar8->ExtentsX).Max = (double)CONCAT44(uVar25,uVar23);
            }
          }
        }
        else if ((((ulong)ABS(dVar1) < 0x7ff0000000000000) &&
                 (pIVar6->YAxis[iVar15].Range.Min <= dVar18)) &&
                (dVar18 <= pIVar6->YAxis[iVar15].Range.Max)) goto LAB_001e8198;
        if ((uVar5 >> 10 & 1) == 0) {
          if ((ulong)ABS(dVar18) < 0x7ff0000000000000) {
LAB_001e8209:
            if ((0.0 < dVar18) || ((int)local_88 == 0)) {
              dVar1 = pIVar7[iVar15].Min;
              dVar22 = dVar18;
              if (dVar1 <= dVar18) {
                dVar22 = dVar1;
              }
              pIVar7[iVar15].Min = dVar22;
              dVar1 = pIVar8->ExtentsY[iVar15].Max;
              if (dVar18 <= dVar1) {
                uVar19 = SUB84(dVar1,0);
                uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
              }
              pIVar8->ExtentsY[iVar15].Max = (double)CONCAT44(uVar20,uVar19);
            }
          }
        }
        else if ((((ulong)ABS(dVar18) < 0x7ff0000000000000) && ((pIVar6->XAxis).Range.Min <= dVar1))
                && (dVar1 <= (pIVar6->XAxis).Range.Max)) goto LAB_001e8209;
        iVar14 = iVar14 + 1;
      } while (iVar2 != iVar14);
    }
    local_90 = getter;
    local_78 = GetPlotDrawList();
    getter_00 = local_90;
    if ((1 < local_90->Count) && ((pIVar8->NextItemData).RenderLine == true)) {
      col = ImGui::GetColorU32((pIVar8->NextItemData).Colors);
      iVar2 = GImPlot->CurrentPlot->CurrentYAxis;
      switch(GImPlot->Scales[iVar2]) {
      case 0:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin>
                  (getter_00,(TransformerLinLin *)&local_a0,local_78,
                   (pIVar8->NextItemData).LineWeight,col);
        break;
      case 1:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin>
                  (getter_00,(TransformerLogLin *)&local_a0,local_78,
                   (pIVar8->NextItemData).LineWeight,col);
        break;
      case 2:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog>
                  (getter_00,(TransformerLinLog *)&local_a0,local_78,
                   (pIVar8->NextItemData).LineWeight,col);
        break;
      case 3:
        local_a0 = CONCAT44(local_a0._4_4_,iVar2);
        RenderStairs<ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLog>
                  (getter_00,(TransformerLogLog *)&local_a0,local_78,
                   (pIVar8->NextItemData).LineWeight,col);
      }
    }
    if ((pIVar8->NextItemData).Marker != -1) {
      PopPlotClipRect();
      PushPlotClipRect((pIVar8->NextItemData).MarkerSize);
      local_7c = ImGui::GetColorU32((pIVar8->NextItemData).Colors + 2);
      local_80 = ImGui::GetColorU32((pIVar8->NextItemData).Colors + 3);
      transformer.YAxis = GImPlot->CurrentPlot->CurrentYAxis;
      uVar11 = (ulong)transformer.YAxis;
      local_40 = GImPlot;
      local_88 = uVar11;
      switch(GImPlot->Scales[uVar11]) {
      case 0:
        iVar2 = getter_00->Count;
        if (0 < iVar2) {
          pdVar12 = getter_00->Xs;
          pdVar13 = getter_00->Ys;
          iVar16 = getter_00->Offset;
          local_58 = CONCAT44(local_58._4_4_,(pIVar8->NextItemData).MarkerSize);
          local_60 = CONCAT44(local_60._4_4_,(pIVar8->NextItemData).MarkerWeight);
          local_68 = (ulong)(pIVar8->NextItemData).Marker;
          iVar3 = getter_00->Stride;
          iVar15 = 0;
          local_90 = (GetterXsYs<double> *)
                     CONCAT44(local_90._4_4_,(uint)(pIVar8->NextItemData).RenderMarkerLine);
          local_94 = (float)(uint)(pIVar8->NextItemData).RenderMarkerFill;
          local_50 = pdVar12;
          local_48 = pdVar13;
          do {
            lVar10 = (long)(((iVar16 + iVar15) % iVar2 + iVar2) % iVar2) * (long)iVar3;
            fVar17 = (float)((*(double *)((long)pdVar12 + lVar10) -
                             (GImPlot->CurrentPlot->XAxis).Range.Min) * GImPlot->Mx +
                            (double)GImPlot->PixelRange[uVar11].Min.x);
            fVar21 = (float)((*(double *)((long)pdVar13 + lVar10) -
                             GImPlot->CurrentPlot->YAxis[uVar11].Range.Min) * GImPlot->My[local_88]
                            + (double)GImPlot->PixelRange[uVar11].Min.y);
            local_a0 = CONCAT44(fVar21,fVar17);
            pIVar6 = local_40->CurrentPlot;
            if ((((pIVar6->PlotRect).Min.x <= fVar17) && ((pIVar6->PlotRect).Min.y <= fVar21)) &&
               ((fVar17 < (pIVar6->PlotRect).Max.x && (fVar21 < (pIVar6->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_68 * 8))
                        (local_58 & 0xffffffff,(undefined4)local_60,local_78,&local_a0,
                         (ulong)local_90 & 0xffffffff,local_7c,local_94,local_80);
              pdVar12 = local_50;
              pdVar13 = local_48;
            }
            iVar15 = iVar15 + 1;
          } while (iVar2 != iVar15);
        }
        break;
      case 1:
        iVar2 = getter_00->Count;
        if (0 < iVar2) {
          local_48 = getter_00->Xs;
          local_50 = getter_00->Ys;
          local_58 = (ulong)(uint)getter_00->Offset;
          local_68 = CONCAT44(local_68._4_4_,(pIVar8->NextItemData).MarkerSize);
          local_94 = (pIVar8->NextItemData).MarkerWeight;
          local_38 = (long)(pIVar8->NextItemData).Marker;
          local_60 = (long)getter_00->Stride;
          iVar16 = 0;
          local_6c = (uint)(pIVar8->NextItemData).RenderMarkerLine;
          bVar9 = (pIVar8->NextItemData).RenderMarkerFill;
          do {
            pIVar8 = GImPlot;
            lVar10 = ((((int)local_58 + iVar16) % iVar2 + iVar2) % iVar2) * local_60;
            local_90 = *(GetterXsYs<double> **)((long)local_50 + lVar10);
            dVar18 = log10(*(double *)((long)local_48 + lVar10) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar6 = pIVar8->CurrentPlot;
            dVar1 = (pIVar6->XAxis).Range.Min;
            fVar17 = (float)((((double)(float)(dVar18 / pIVar8->LogDenX) *
                               ((pIVar6->XAxis).Range.Max - dVar1) + dVar1) - dVar1) * pIVar8->Mx +
                            (double)pIVar8->PixelRange[uVar11].Min.x);
            fVar21 = (float)(((double)local_90 - pIVar6->YAxis[uVar11].Range.Min) *
                             pIVar8->My[local_88] + (double)pIVar8->PixelRange[uVar11].Min.y);
            local_a0 = CONCAT44(fVar21,fVar17);
            pIVar6 = local_40->CurrentPlot;
            if ((((pIVar6->PlotRect).Min.x <= fVar17) && ((pIVar6->PlotRect).Min.y <= fVar21)) &&
               ((fVar17 < (pIVar6->PlotRect).Max.x && (fVar21 < (pIVar6->PlotRect).Max.y)))) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLogLin,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_38 * 8))
                        (local_68 & 0xffffffff,local_94,local_78,&local_a0,local_6c,local_7c,bVar9,
                         local_80);
            }
            iVar16 = iVar16 + 1;
          } while (iVar2 != iVar16);
        }
        break;
      case 2:
        iVar2 = getter_00->Count;
        if (0 < iVar2) {
          local_48 = getter_00->Xs;
          local_50 = getter_00->Ys;
          local_58 = (ulong)(uint)getter_00->Offset;
          local_68 = CONCAT44(local_68._4_4_,(pIVar8->NextItemData).MarkerSize);
          local_94 = (pIVar8->NextItemData).MarkerWeight;
          local_38 = (long)(pIVar8->NextItemData).Marker;
          local_60 = (long)getter_00->Stride;
          iVar16 = 0;
          local_6c = (uint)(pIVar8->NextItemData).RenderMarkerLine;
          bVar9 = (pIVar8->NextItemData).RenderMarkerFill;
          do {
            pIVar8 = GImPlot;
            lVar10 = ((((int)local_58 + iVar16) % iVar2 + iVar2) % iVar2) * local_60;
            local_90 = *(GetterXsYs<double> **)((long)local_48 + lVar10);
            dVar18 = log10(*(double *)((long)local_50 + lVar10) /
                           GImPlot->CurrentPlot->YAxis[uVar11].Range.Min);
            pIVar6 = pIVar8->CurrentPlot;
            dVar1 = pIVar6->YAxis[uVar11].Range.Min;
            fVar21 = (float)(((double)local_90 - (pIVar6->XAxis).Range.Min) * pIVar8->Mx +
                            (double)pIVar8->PixelRange[uVar11].Min.x);
            fVar17 = (float)((((double)(float)(dVar18 / pIVar8->LogDenY[local_88]) *
                               (pIVar6->YAxis[uVar11].Range.Max - dVar1) + dVar1) - dVar1) *
                             pIVar8->My[local_88] + (double)pIVar8->PixelRange[uVar11].Min.y);
            local_a0 = CONCAT44(fVar17,fVar21);
            pIVar6 = local_40->CurrentPlot;
            if (((((pIVar6->PlotRect).Min.x <= fVar21) && ((pIVar6->PlotRect).Min.y <= fVar17)) &&
                (fVar21 < (pIVar6->PlotRect).Max.x)) && (fVar17 < (pIVar6->PlotRect).Max.y)) {
              (**(code **)(RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterXsYs<double>>(ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLog,ImDrawList&,int,float,bool,unsigned_int,float,bool,unsigned_int)
                           ::marker_table + local_38 * 8))
                        (local_68 & 0xffffffff,local_94,local_78,&local_a0,local_6c,local_7c,bVar9,
                         local_80);
            }
            iVar16 = iVar16 + 1;
          } while (iVar2 != iVar16);
        }
        break;
      case 3:
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<double>>
                  (*getter_00,transformer,local_78,(pIVar8->NextItemData).Marker,
                   (pIVar8->NextItemData).MarkerSize,(pIVar8->NextItemData).RenderMarkerLine,
                   local_7c,(pIVar8->NextItemData).MarkerWeight,
                   (pIVar8->NextItemData).RenderMarkerFill,local_80);
      }
    }
    pIVar8 = GImPlot;
    PopPlotClipRect();
    ImPlotNextItemData::Reset(&pIVar8->NextItemData);
    pIVar8->PreviousItem = pIVar8->CurrentItem;
    pIVar8->CurrentItem = (ImPlotItem *)0x0;
  }
  return;
}

Assistant:

inline void PlotStairsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderStairs(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderStairs(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderStairs(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderStairs(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}